

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_&,_const_wchar_t_(&)[6]>
::streamReconstructedExpression
          (BinaryExpr<const_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_&,_const_wchar_t_(&)[6]>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *in_RDX;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  Detail::stringify<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
            (&local_40,(Detail *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  rangeToString<wchar_t[6]>(&local_60,this->m_rhs);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }